

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O3

int Hop_ManCleanup(Hop_Man_t *p)

{
  Hop_Obj_t *pHVar1;
  undefined8 uVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int local_38;
  int local_34;
  
  if (p->fRefCount == 0) {
    __assert_fail("p->fRefCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopMan.c"
                  ,0x7d,"int Hop_ManCleanup(Hop_Man_t *)");
  }
  local_38 = p->nObjs[4];
  local_34 = p->nObjs[5];
  uVar2 = *(undefined8 *)(p->nObjs + 4);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr + 2) = pvVar4;
  iVar3 = p->nTableSize;
  if (iVar3 < 1) {
LAB_007ed99e:
    if (pvVar4 == (void *)0x0) goto LAB_007ed9ab;
  }
  else {
    uVar8 = 0;
    uVar7 = 100;
    lVar9 = 0;
    do {
      pHVar1 = p->pTable[lVar9];
      if ((pHVar1 != (Hop_Obj_t *)0x0) && (*(uint *)&pHVar1->field_0x20 < 0x40)) {
        uVar6 = (uint)uVar7;
        if (uVar8 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uVar6 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(uVar7 * 8);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),uVar7 * 8);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = uVar6 * 2;
          }
        }
        else {
          pvVar4 = *(void **)(__ptr + 2);
        }
        lVar5 = (long)(int)uVar8;
        uVar8 = uVar8 + 1;
        __ptr[1] = uVar8;
        *(Hop_Obj_t **)((long)pvVar4 + lVar5 * 8) = pHVar1;
        iVar3 = p->nTableSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar3);
    pvVar4 = *(void **)(__ptr + 2);
    local_34 = (int)((ulong)uVar2 >> 0x20);
    local_38 = (int)uVar2;
    if ((int)uVar8 < 1) goto LAB_007ed99e;
    uVar7 = 0;
    do {
      Hop_ObjDelete_rec(p,*(Hop_Obj_t **)((long)pvVar4 + uVar7 * 8));
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  free(pvVar4);
LAB_007ed9ab:
  free(__ptr);
  return (local_34 + local_38) - (p->nObjs[4] + p->nObjs[5]);
}

Assistant:

int Hop_ManCleanup( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pNode;
    int i, nNodesOld;
    assert( p->fRefCount );
    nNodesOld = Hop_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Hop_ManForEachNode( p, pNode, i )
        if ( Hop_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, vObjs, pNode, i )
        Hop_ObjDelete_rec( p, pNode );
    Vec_PtrFree( vObjs );
    return nNodesOld - Hop_ManNodeNum(p);
}